

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

WordType llvm::APInt::tcSubtract(WordType *dst,WordType *rhs,WordType c,uint parts)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  WordType WVar4;
  bool bVar5;
  
  if (c < 2) {
    if (parts != 0) {
      uVar3 = 0;
      do {
        uVar1 = dst[uVar3];
        uVar2 = rhs[uVar3];
        if (c == 0) {
          bVar5 = uVar1 < uVar2;
          WVar4 = uVar1 - uVar2;
        }
        else {
          WVar4 = ~uVar2 + uVar1;
          bVar5 = uVar1 <= WVar4;
        }
        dst[uVar3] = WVar4;
        c = (WordType)bVar5;
        uVar3 = uVar3 + 1;
      } while (parts != uVar3);
    }
    return c;
  }
  __assert_fail("c <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x91d,
                "static APInt::WordType llvm::APInt::tcSubtract(WordType *, const WordType *, WordType, unsigned int)"
               );
}

Assistant:

APInt::WordType APInt::tcSubtract(WordType *dst, const WordType *rhs,
                                  WordType c, unsigned parts) {
  assert(c <= 1);

  for (unsigned i = 0; i < parts; i++) {
    WordType l = dst[i];
    if (c) {
      dst[i] -= rhs[i] + 1;
      c = (dst[i] >= l);
    } else {
      dst[i] -= rhs[i];
      c = (dst[i] > l);
    }
  }

  return c;
}